

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_spinlock_lock_noyield(ma_spinlock *pSpinlock)

{
  ma_result mVar1;
  ma_spinlock mVar2;
  
  if (pSpinlock == (ma_spinlock *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    LOCK();
    mVar2 = *pSpinlock;
    *pSpinlock = 1;
    UNLOCK();
    mVar1 = MA_SUCCESS;
    while (mVar2 != 0) {
      do {
      } while (*pSpinlock == 1);
      LOCK();
      mVar2 = *pSpinlock;
      *pSpinlock = 1;
      UNLOCK();
    }
  }
  return mVar1;
}

Assistant:

static MA_INLINE ma_result ma_spinlock_lock_ex(volatile ma_spinlock* pSpinlock, ma_bool32 yield)
{
    if (pSpinlock == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        if (ma_atomic_exchange_explicit_32(pSpinlock, 1, ma_atomic_memory_order_acquire) == 0) {
            break;
        }

        while (ma_atomic_load_explicit_32(pSpinlock, ma_atomic_memory_order_relaxed) == 1) {
            if (yield) {
                ma_yield();
            }
        }
    }

    return MA_SUCCESS;
}